

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O2

CSharedMemoryObject * CorUnix::CSharedMemoryObject::GetObjectFromListLink(PLIST_ENTRY ple)

{
  if (ple == (PLIST_ENTRY)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetObjectFromListLink",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x393);
    fprintf(_stderr,"Expression: NULL != ple\n");
  }
  if ((PAL_InitializeChakraCoreCalled != false) && ((PAL_InitializeChakraCoreCalled & 1U) != 0)) {
    return (CSharedMemoryObject *)&ple[-0xf].Blink;
  }
  abort();
}

Assistant:

CSharedMemoryObject*
CSharedMemoryObject::GetObjectFromListLink(PLIST_ENTRY ple)
{
    CSharedMemoryObject *pshmo;

    _ASSERTE(NULL != ple);

    ENTRY("CSharedMemoryObject::GetObjectFromListLink(ple = %p)\n", ple);
    
    //
    // Ideally we'd use CONTAINING_RECORD here, but it uses offsetof (see above
    // comment
    //
    
    pshmo = reinterpret_cast<CSharedMemoryObject*>(
        reinterpret_cast<size_t>(ple) - PAL_safe_offsetof(CSharedMemoryObject, m_le)
        );

    _ASSERTE(ple == &pshmo->m_le);

    LOGEXIT("CSharedMemoryObject::GetObjectFromListLink returns %p\n", pshmo);

    return pshmo;
}